

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SimpleVolPathIntegrator::Li
          (SimpleVolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *buf,VisibleSurface *param_5)

{
  Vector3f *this_00;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar1;
  DenselySampledSpectrum *pDVar2;
  Transform *pTVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  TVar8;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *pTVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  uint64_t sequenceIndex;
  uint64_t seed;
  ShapeIntersection *pSVar16;
  ShapeIntersection *pSVar17;
  int iVar18;
  float *pfVar19;
  DenselySampledSpectrum *pDVar20;
  float *pfVar21;
  int iVar22;
  Float FVar23;
  ulong uVar24;
  Transform *pTVar25;
  float *pfVar26;
  DenselySampledSpectrum *this_01;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  Float *pFVar32;
  int *piVar33;
  int *piVar34;
  int *piVar35;
  LightHandle *light;
  Float *pFVar36;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *this_02;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  Float FVar41;
  type tVar42;
  float fVar43;
  undefined1 auVar44 [16];
  Point2f u2;
  undefined8 uVar133;
  undefined1 auVar47 [32];
  undefined1 auVar50 [64];
  undefined1 auVar131 [56];
  undefined1 auVar51 [64];
  undefined1 auVar132 [56];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar45 [16];
  undefined1 auVar48 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined8 uVar130;
  undefined1 auVar46 [16];
  undefined1 auVar49 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar213 [60];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar220;
  float fVar221;
  undefined1 auVar223 [12];
  undefined1 auVar222 [16];
  undefined1 in_ZMM4 [64];
  float fVar224;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar234 [12];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 in_ZMM6 [64];
  float fVar235;
  undefined1 auVar239 [12];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 in_ZMM7 [64];
  Vector3<float> VVar240;
  Point3f PVar241;
  Point3f p;
  Point3<float> PVar242;
  anon_class_16_2_2793a994 func;
  SampledSpectrum SVar243;
  SampledSpectrum a;
  SampledSpectrum a_00;
  bool terminated;
  bool scattered;
  undefined1 local_538 [16];
  float local_520;
  Float tMax;
  undefined1 local_518 [16];
  Float tMin;
  int voxel [3];
  Float nextCrossingT [3];
  SampledSpectrum d;
  SampledSpectrum sigma_a_3;
  float fStack_4b0;
  float local_4ac;
  Float local_4a8;
  MediumHandle local_4a0;
  SampledSpectrum TmajAccum;
  Tuple3<pbrt::Point3,_float> local_488;
  SampledSpectrum Tmaj;
  Float uMode;
  int numScatters;
  float local_458;
  float fStack_454;
  undefined8 uStack_450;
  SampledSpectrum sigma_maj;
  Ray local_438;
  undefined1 local_408 [16];
  Transform *local_3f8;
  SimpleVolPathIntegrator *local_3f0;
  Float local_3e8;
  int voxelLimit [3];
  int step [3];
  Float deltaT [3];
  undefined1 local_3a0 [40];
  undefined8 local_378;
  SimpleVolPathIntegrator *local_370;
  RayDifferential *local_368;
  SamplerHandle *local_360;
  bool *local_358;
  RNG *local_350;
  undefined1 local_348 [16];
  SampledSpectrum L;
  SampledSpectrum sigma_s;
  SampledSpectrum sigma_a;
  SampledSpectrum sigma_s_3;
  float fStack_2f0;
  BSDF bsdf;
  SampledSpectrum local_240;
  SampledSpectrum *local_230;
  RNG rng;
  SampledSpectrum beta;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  SampledSpectrum sigma_t;
  uintptr_t local_188;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_180;
  undefined8 local_178;
  ulong uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  optional<pbrt::ShapeIntersection> si;
  undefined1 auVar59 [64];
  undefined1 auVar122 [64];
  undefined1 auVar129 [64];
  undefined1 extraout_var [60];
  undefined1 auVar146 [64];
  undefined1 auVar173 [64];
  
  local_3f0 = this;
  SampledSpectrum::SampledSpectrum(&L,0.0);
  SampledSpectrum::SampledSpectrum(&beta,1.0);
  numScatters = 0;
  SampledWavelengths::TerminateSecondary(lambda);
  this_00 = &(ray->super_Ray).d;
  local_230 = &local_240;
LAB_00411b30:
  auVar50 = ZEXT464(0x7f800000);
  Integrator::Intersect(&si,(Integrator *)local_3f0,&ray->super_Ray,INFINITY);
  scattered = false;
  terminated = false;
  if (((ray->super_Ray).medium.
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
       .bits & 0xffffffffffff) != 0) {
    FVar41 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
             ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                       ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                         *)sampler);
    sequenceIndex = Hash<float>(FVar41);
    FVar41 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
             ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                       ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                         *)sampler);
    seed = Hash<float>(FVar41);
    RNG::SetSequence(&rng,sequenceIndex,seed);
    local_538._0_4_ = 0x7f800000;
    if (si.set == true) {
      pSVar16 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      local_538._0_4_ = pSVar16->tHit;
    }
    FVar41 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
             ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                       ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                         *)sampler);
    local_408._0_4_ = FVar41;
    uMode = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
            ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                        *)sampler);
    TVar8.bits = (ray->super_Ray).medium.
                 super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 .bits;
    this_01 = (DenselySampledSpectrum *)(TVar8.bits & 0xffffffffffff);
    local_3a0._24_8_ = lambda;
    local_368 = ray;
    local_360 = sampler;
    if (TVar8.bits < 0x3000000000000) {
      if ((TVar8.bits & 0x3000000000000) == 0x2000000000000) {
        sigma_s_3.values.values[0] = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
        sigma_s_3.values.values[1] = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
        uVar130 = *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        auVar5._0_12_ = *(undefined1 (*) [12])&(ray->super_Ray).d;
        auVar5._12_4_ = (ray->super_Ray).time;
        auVar213 = ZEXT1260(auVar5._4_12_);
        local_3a0._8_8_ = &L;
        local_3a0._0_8_ = &uMode;
        sigma_s_3.values.values[2] = (float)uVar130;
        sigma_s_3.values.values[3] = (float)((ulong)uVar130 >> 0x20);
        local_3a0._16_8_ = &beta;
        local_3a0._32_8_ = &terminated;
        local_378 = &numScatters;
        local_370 = local_3f0;
        local_358 = &scattered;
        local_520 = (float)local_538._0_4_;
        local_350 = &rng;
        SampledSpectrum::SampledSpectrum(&TmajAccum,1.0);
        local_3f8 = (Transform *)(this_01 + 3);
        Transform::ApplyInverse(&local_438,local_3f8,(Ray *)&sigma_s_3,&local_520);
        tVar42 = Length<float>(&local_438.d);
        local_520 = tVar42 * local_520;
        auVar131 = (undefined1  [56])0x0;
        VVar240 = Normalize<float>(&local_438.d);
        in_ZMM1._0_4_ = VVar240.super_Tuple3<pbrt::Vector3,_float>.z;
        in_ZMM1._4_60_ = auVar213;
        auVar51._0_8_ = VVar240.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar51._8_56_ = auVar131;
        uVar130 = vmovlps_avx(auVar51._0_16_);
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar130;
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar130 >> 0x20);
        pvVar1 = &this_01->values;
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.z = in_ZMM1._0_4_;
        bVar15 = Bounds3<float>::IntersectP
                           ((Bounds3<float> *)pvVar1,&local_438.o,&local_438.d,local_520,&tMin,&tMax
                           );
        auVar239 = in_ZMM7._4_12_;
        auVar234 = in_ZMM6._4_12_;
        auVar223 = in_ZMM4._4_12_;
        auVar131 = in_ZMM1._8_56_;
        if (bVar15) {
          auVar132 = (undefined1  [56])0x0;
          local_538._0_4_ = *(Float *)&this_01[2].values.nStored;
          SVar243 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&(this_01->values).nStored,lambda);
          auVar141._0_8_ = SVar243.values.values._8_8_;
          auVar141._8_56_ = auVar131;
          auVar52._0_8_ = SVar243.values.values._0_8_;
          auVar52._8_56_ = auVar132;
          bsdf._0_16_ = vmovlhps_avx(auVar52._0_16_,auVar141._0_16_);
          auVar132 = (undefined1  [56])0x0;
          SVar243 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_538._0_4_);
          auVar142._0_8_ = SVar243.values.values._8_8_;
          auVar142._8_56_ = auVar131;
          auVar53._0_8_ = SVar243.values.values._0_8_;
          auVar53._8_56_ = auVar132;
          sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar53._0_16_,auVar142._0_16_);
          local_538._0_4_ = *(undefined4 *)&this_01[2].values.nStored;
          auVar132 = (undefined1  [56])0x0;
          SVar243 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&this_01[1].values.nStored,lambda);
          auVar143._0_8_ = SVar243.values.values._8_8_;
          auVar143._8_56_ = auVar131;
          auVar54._0_8_ = SVar243.values.values._0_8_;
          auVar54._8_56_ = auVar132;
          bsdf._0_16_ = vmovlhps_avx(auVar54._0_16_,auVar143._0_16_);
          auVar132 = (undefined1  [56])0x0;
          SVar243 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_538._0_4_);
          auVar144._0_8_ = SVar243.values.values._8_8_;
          auVar144._8_56_ = auVar131;
          auVar55._0_8_ = SVar243.values.values._0_8_;
          auVar55._8_56_ = auVar132;
          sigma_s.values.values = (array<float,_4>)vmovlhps_avx(auVar55._0_16_,auVar144._0_16_);
          auVar132 = ZEXT856(sigma_s.values.values._8_8_);
          SVar243 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
          auVar145._0_8_ = SVar243.values.values._8_8_;
          auVar145._8_56_ = auVar131;
          auVar56._0_8_ = SVar243.values.values._0_8_;
          auVar56._8_56_ = auVar132;
          sigma_t.values.values = (array<float,_4>)vmovlhps_avx(auVar56._0_16_,auVar145._0_16_);
          auVar131 = ZEXT856(sigma_t.values.values._8_8_);
          VVar240 = Bounds3<float>::Diagonal((Bounds3<float> *)pvVar1);
          auVar213 = auVar145._4_60_;
          local_538._0_4_ = VVar240.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar57._0_8_ = VVar240.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar57._8_56_ = auVar131;
          local_518 = auVar57._0_16_;
          VVar240 = Bounds3<float>::Offset((Bounds3<float> *)pvVar1,&local_438.o);
          sigma_a_3.values.values[2] = VVar240.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar58._0_8_ = VVar240.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar58._8_56_ = auVar131;
          auVar214._4_4_ = local_438.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar214._0_4_ = local_438.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar214._8_8_ = 0;
          sigma_a_3.values.values._0_8_ = vmovlps_avx(auVar58._0_16_);
          auVar131 = (undefined1  [56])0x0;
          auVar39 = vdivps_avx(auVar214,local_518);
          local_4ac = local_438.d.super_Tuple3<pbrt::Vector3,_float>.z / (float)local_538._0_4_;
          uVar130 = vmovlps_avx(auVar39);
          sigma_a_3.values.values[3] = (float)uVar130;
          fStack_4b0 = (float)((ulong)uVar130 >> 0x20);
          local_4a8 = 0.0;
          local_4a0.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )0;
          PVar241 = Ray::operator()((Ray *)&sigma_a_3,tMin);
          auVar146._0_4_ = PVar241.super_Tuple3<pbrt::Point3,_float>.z;
          auVar146._4_60_ = auVar213;
          auVar59._0_8_ = PVar241.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar59._8_56_ = auVar131;
          piVar34 = &this_01[7].lambda_max;
          uVar7 = this_01[7].lambda_min;
          uVar24 = CONCAT44(0,uVar7);
          auVar216 = vmovshdup_avx(auVar59._0_16_);
          auVar40 = ZEXT816(0) << 0x40;
          pDVar2 = this_01 + 7;
          lVar31 = 0;
          iVar28 = this_01[7].lambda_max;
          local_518._0_8_ = uVar24;
          fVar220 = (float)iVar28;
          auVar225._0_4_ = (float)(iVar28 + -1);
          auVar225._4_12_ = auVar223;
          auVar222 = ZEXT416((uint)(auVar216._0_4_ * fVar220));
          auVar39 = vminss_avx(auVar225,auVar222);
          uVar130 = vcmpss_avx512f(auVar222,auVar40,1);
          fVar221 = (float)(int)uVar7;
          in_ZMM4 = ZEXT1664(CONCAT124(auVar234,fVar221));
          auVar231._0_4_ = (float)(int)(uVar7 - 1);
          auVar231._4_12_ = auVar234;
          iVar27 = *(int *)&this_01[7].values.alloc.memoryResource;
          iVar18 = (int)(float)((uint)!(bool)((byte)uVar130 & 1) * auVar39._0_4_);
          auVar222 = ZEXT416((uint)(PVar241.super_Tuple3<pbrt::Point3,_float>.x * fVar221));
          auVar39 = vminss_avx(auVar231,auVar222);
          uVar130 = vcmpss_avx512f(auVar222,auVar40,1);
          fVar224 = (float)iVar27;
          auVar236._0_4_ = (float)(iVar27 + -1);
          auVar236._4_12_ = auVar239;
          fVar43 = (float)((uint)!(bool)((byte)uVar130 & 1) * auVar39._0_4_);
          auVar37._4_12_ = auVar39._4_12_;
          auVar37._0_4_ = fVar43;
          iVar27 = (int)fVar43;
          auVar39 = vminss_avx(auVar236,ZEXT416((uint)(auVar146._0_4_ * fVar224)));
          uVar130 = vcmpss_avx512f(ZEXT416((uint)(auVar146._0_4_ * fVar224)),auVar40,1);
          iVar29 = (int)(float)((uint)!(bool)((byte)uVar130 & 1) * auVar39._0_4_);
          in_ZMM7 = ZEXT464((uint)tMin);
          local_538._0_4_ = tMin;
          while( true ) {
            in_ZMM6 = ZEXT1664(auVar37);
            if (lVar31 == 3) break;
            iVar30 = (int)lVar31;
            if (iVar30 == 1) {
              voxel[1] = iVar18;
              piVar33 = voxelLimit + 1;
              piVar35 = step + 1;
              pFVar32 = deltaT + 1;
              pfVar21 = nextCrossingT + 1;
              pfVar26 = &fStack_4b0;
              iVar22 = iVar18;
            }
            else if (iVar30 == 0) {
              voxel[lVar31] = iVar27;
              piVar33 = voxelLimit;
              piVar35 = step;
              pFVar32 = deltaT;
              pfVar21 = nextCrossingT;
              pfVar26 = sigma_a_3.values.values + 3;
              iVar22 = iVar27;
            }
            else {
              piVar33 = voxelLimit + 2;
              piVar35 = step + 2;
              pFVar32 = deltaT + 2;
              pfVar21 = nextCrossingT + 2;
              pfVar26 = &local_4ac;
              voxel[lVar31] = iVar29;
              iVar22 = iVar29;
            }
            if ((*pfVar26 == 0.0) && (!NAN(*pfVar26))) {
              pfVar26 = sigma_a_3.values.values + 3;
              if ((iVar30 != 0) && (pfVar26 = &fStack_4b0, iVar30 != 1)) {
                pfVar26 = &local_4ac;
              }
              *pfVar26 = 0.0;
            }
            pfVar26 = sigma_a_3.values.values + 3;
            if ((iVar30 != 0) && (pfVar26 = &fStack_4b0, iVar30 != 1)) {
              pfVar26 = &local_4ac;
            }
            if (0.0 <= *pfVar26) {
              pfVar26 = sigma_a_3.values.values + 3;
              pDVar20 = pDVar2;
              fVar43 = fVar221;
              fVar235 = PVar241.super_Tuple3<pbrt::Point3,_float>.x;
              if ((iVar30 != 0) &&
                 (pfVar26 = &fStack_4b0, pDVar20 = (DenselySampledSpectrum *)piVar34,
                 fVar43 = fVar220, fVar235 = auVar216._0_4_, iVar30 != 1)) {
                pfVar26 = &local_4ac;
                pDVar20 = (DenselySampledSpectrum *)&this_01[7].values;
                fVar43 = fVar224;
                fVar235 = auVar146._0_4_;
              }
              *piVar35 = 1;
              fVar4 = *pfVar26;
              fVar235 = ((float)(iVar22 + 1) / fVar43 - fVar235) / fVar4 + tMin;
              in_ZMM7 = ZEXT464((uint)fVar235);
              *pfVar21 = fVar235;
              *pFVar32 = 1.0 / (fVar4 * fVar43);
              iVar30 = pDVar20->lambda_min;
            }
            else {
              pfVar26 = sigma_a_3.values.values + 3;
              in_ZMM7 = ZEXT1664(auVar59._0_16_);
              pDVar20 = pDVar2;
              fVar43 = fVar221;
              if (iVar30 != 0) {
                pfVar26 = &fStack_4b0;
                in_ZMM7 = ZEXT1664(auVar216);
                pDVar20 = (DenselySampledSpectrum *)piVar34;
                fVar43 = fVar220;
                if (iVar30 != 1) {
                  pfVar26 = &local_4ac;
                  in_ZMM7 = ZEXT1664(auVar146._0_16_);
                  pDVar20 = (DenselySampledSpectrum *)&this_01[7].values;
                  fVar43 = fVar224;
                }
              }
              fVar235 = *pfVar26;
              *pfVar21 = ((float)iVar22 / fVar43 - in_ZMM7._0_4_) / fVar235 + tMin;
              iVar30 = pDVar20->lambda_min;
              *piVar35 = -1;
              *pFVar32 = -1.0 / (fVar235 * (float)iVar30);
              iVar30 = -1;
            }
            auVar37 = ZEXT416(0);
            *piVar33 = iVar30;
            lVar31 = lVar31 + 1;
          }
          auVar50 = ZEXT464((uint)tMax);
          while( true ) {
            iVar27 = *(int *)(&DAT_0053dd60 +
                             (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                    (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                    (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
            local_3e8 = nextCrossingT[iVar27];
            auVar132 = (undefined1  [56])0x0;
            auVar39 = vminss_avx(ZEXT416((uint)local_3e8),auVar50._0_16_);
            local_458 = auVar39._0_4_;
            auVar131 = (undefined1  [56])0x0;
            SVar243 = SampledSpectrum::operator*
                                (&sigma_t,this_01[6].values.ptr
                                          [(long)((iVar28 * voxel[2] + voxel[1]) * (int)uVar24) +
                                           (long)voxel[0]]);
            auVar165._0_8_ = SVar243.values.values._8_8_;
            auVar165._8_56_ = auVar132;
            auVar85._0_8_ = SVar243.values.values._0_8_;
            auVar85._8_56_ = auVar131;
            auVar50 = ZEXT1664(auVar85._0_16_);
            sigma_maj.values.values = (array<float,_4>)vmovlhps_avx(auVar85._0_16_,auVar165._0_16_);
            auVar131 = ZEXT856(sigma_maj.values.values._8_8_);
            if ((SVar243.values.values[0] != 0.0) || (NAN(SVar243.values.values[0]))) {
              while( true ) {
                FVar41 = SampleExponential((Float)local_408._0_4_,auVar50._0_4_);
                local_518._0_4_ = FVar41;
                fVar43 = RNG::Uniform<float>(&rng);
                auVar216 = in_ZMM7._0_16_;
                auVar39 = in_ZMM6._0_16_;
                local_408._0_4_ = fVar43;
                auVar131 = (undefined1  [56])0x0;
                fVar43 = (float)local_518._0_4_ + (float)local_538._0_4_;
                auVar132 = (undefined1  [56])0x0;
                if (local_458 <= fVar43) break;
                auVar131 = (undefined1  [56])0x0;
                if (fVar43 < tMax) {
                  local_518._0_4_ = fVar43;
                  SVar243 = SampledSpectrum::operator-(&sigma_maj);
                  auVar169._0_8_ = SVar243.values.values._8_8_;
                  auVar169._8_56_ = auVar132;
                  auVar89._0_8_ = SVar243.values.values._0_8_;
                  auVar89._8_56_ = auVar131;
                  d.values.values = (array<float,_4>)vmovlhps_avx(auVar89._0_16_,auVar169._0_16_);
                  auVar131 = (undefined1  [56])0x0;
                  SVar243 = SampledSpectrum::operator*
                                      (&d,(float)local_518._0_4_ - (float)local_538._0_4_);
                  auVar170._0_8_ = SVar243.values.values._8_8_;
                  auVar170._8_56_ = auVar132;
                  auVar90._0_8_ = SVar243.values.values._0_8_;
                  auVar90._8_56_ = auVar131;
                  bsdf._0_16_ = vmovlhps_avx(auVar90._0_16_,auVar170._0_16_);
                  auVar131 = ZEXT856(bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_);
                  SVar243 = FastExp((SampledSpectrum *)&bsdf);
                  auVar171._0_8_ = SVar243.values.values._8_8_;
                  auVar171._8_56_ = auVar132;
                  auVar91._0_8_ = SVar243.values.values._0_8_;
                  auVar91._8_56_ = auVar131;
                  Tmaj.values.values = (array<float,_4>)vmovlhps_avx(auVar91._0_16_,auVar171._0_16_)
                  ;
                  auVar131 = (undefined1  [56])0x0;
                  PVar241 = Ray::operator()(&local_438,(Float)local_518._0_4_);
                  local_488.z = PVar241.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar92._0_8_ = PVar241.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  auVar92._8_56_ = auVar131;
                  local_488._0_8_ = vmovlps_avx(auVar92._0_16_);
                  SVar243 = UniformGridMediumProvider::Density
                                      (*(UniformGridMediumProvider **)this_01,(Point3f *)&local_488,
                                       lambda);
                  auVar172._0_8_ = SVar243.values.values._8_8_;
                  auVar172._8_56_ = auVar132;
                  auVar93._0_8_ = SVar243.values.values._0_8_;
                  auVar93._8_56_ = auVar131;
                  d.values.values = (array<float,_4>)vmovlhps_avx(auVar93._0_16_,auVar172._0_16_);
                  p.super_Tuple3<pbrt::Point3,_float>.z = local_488.z;
                  p.super_Tuple3<pbrt::Point3,_float>.x = local_488.x;
                  p.super_Tuple3<pbrt::Point3,_float>.y = local_488.y;
                  auVar131 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                  local_1c8._8_8_ = 0;
                  uVar130 = 0;
                  uVar133 = 0;
                  SVar243 = UniformGridMediumProvider::Le
                                      (*(UniformGridMediumProvider **)this_01,p,lambda);
                  auVar173._0_8_ = SVar243.values.values._8_8_;
                  auVar173._8_56_ = auVar131;
                  local_538._8_8_ = local_1c8._8_8_;
                  local_538._0_8_ = SVar243.values.values._0_8_;
                  local_348 = auVar173._0_16_;
                  uVar24 = auVar131._0_8_;
                  SVar243 = SampledSpectrum::operator*(&sigma_a,&d);
                  uStack_170 = uVar24;
                  local_178 = SVar243.values.values._8_8_;
                  local_158 = SVar243.values.values._0_8_;
                  auVar131 = ZEXT856(uStack_170);
                  uStack_150 = local_1c8._8_8_;
                  uStack_148 = uVar130;
                  uStack_140 = uVar133;
                  SVar243 = SampledSpectrum::operator*(&sigma_s,&d);
                  auVar174._0_8_ = SVar243.values.values._8_8_;
                  auVar174._8_56_ = auVar131;
                  local_1c8._0_8_ = SVar243.values.values._0_8_;
                  SampledSpectrum::operator*=(&Tmaj,&TmajAccum);
                  SampledSpectrum::SampledSpectrum((SampledSpectrum *)&bsdf,1.0);
                  TmajAccum.values.values = (array<float,_4>)(array<float,_4>)bsdf._0_16_;
                  uVar24 = bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_;
                  PVar242 = Transform::operator()(local_3f8,(Point3<float> *)&local_488);
                  fVar43 = PVar242.super_Tuple3<pbrt::Point3,_float>.z;
                  local_1e8._8_8_ = uVar24;
                  local_1e8._0_8_ = PVar242.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  VVar240 = Normalize<float>((Vector3<float> *)(sigma_s_3.values.values + 3));
                  auVar217._8_4_ = 0x80000000;
                  auVar217._0_8_ = 0x8000000080000000;
                  auVar217._12_4_ = 0x80000000;
                  auVar228._4_4_ = fVar43;
                  auVar228._0_4_ = fVar43;
                  auVar228._8_4_ = fVar43;
                  auVar228._12_4_ = fVar43;
                  bsdf.shadingFrame._20_16_ = ZEXT816(0);
                  auVar44._0_8_ =
                       VVar240.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  auVar44._8_8_ = uVar24 ^ auVar217._8_8_;
                  bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
                       -VVar240.super_Tuple3<pbrt::Vector3,_float>.z;
                  bsdf._0_16_ = vpermilps_avx(local_1e8,0x50);
                  bsdf._16_8_ = vmovlps_avx(auVar228);
                  bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar5._12_4_;
                  bsdf.shadingFrame._8_8_ = vmovlpd_avx(auVar44);
                  auVar47._16_16_ = auVar174._0_16_;
                  auVar47._0_16_ = auVar44;
                  auVar135._24_8_ = uStack_170;
                  auVar135._16_8_ = local_178;
                  auVar135._0_16_ = auVar44;
                  auVar49 = vperm2f128_avx(auVar135,auVar47,0x31);
                  auVar136._8_8_ = uStack_150;
                  auVar136._0_8_ = local_158;
                  auVar136._16_16_ = local_1c8;
                  vunpcklpd_avx(auVar136,auVar49);
                  vunpcklpd_avx(local_538,local_348);
                  *(array<float,_4> *)(local_230->values).values = Tmaj.values.values;
                  in_ZMM1 = ZEXT1664((undefined1  [16])Tmaj.values.values);
                  in_ZMM4 = ZEXT1664((undefined1  [16])bsdf._0_16_);
                  in_ZMM6 = ZEXT1664(auVar39);
                  in_ZMM7 = ZEXT1664(auVar216);
                  bVar15 = Li::anon_class_88_11_08f5f5b0::operator()
                                     ((anon_class_88_11_08f5f5b0 *)local_3a0,(MediumSample *)&bsdf);
                  if (!bVar15) goto LAB_00413e8c;
                  fVar43 = (float)local_518._0_4_;
                }
                auVar50 = ZEXT464((uint)sigma_maj.values.values[0]);
                local_538._0_4_ = fVar43;
              }
              SVar243 = SampledSpectrum::operator-(&sigma_maj);
              auVar175._0_8_ = SVar243.values.values._8_8_;
              auVar175._8_56_ = auVar132;
              auVar94._0_8_ = SVar243.values.values._0_8_;
              auVar94._8_56_ = auVar131;
              d.values.values = (array<float,_4>)vmovlhps_avx(auVar94._0_16_,auVar175._0_16_);
              auVar131 = (undefined1  [56])0x0;
              SVar243 = SampledSpectrum::operator*(&d,local_458 - (float)local_538._0_4_);
              auVar176._0_8_ = SVar243.values.values._8_8_;
              auVar176._8_56_ = auVar132;
              auVar95._0_8_ = SVar243.values.values._0_8_;
              auVar95._8_56_ = auVar131;
              Tmaj.values.values = (array<float,_4>)vmovlhps_avx(auVar95._0_16_,auVar176._0_16_);
              auVar131 = ZEXT856(Tmaj.values.values._8_8_);
              SVar243 = FastExp(&Tmaj);
              auVar177._0_8_ = SVar243.values.values._8_8_;
              auVar177._8_56_ = auVar132;
              auVar216 = auVar177._0_16_;
              auVar96._0_8_ = SVar243.values.values._0_8_;
              auVar96._8_56_ = auVar131;
              auVar39 = auVar96._0_16_;
            }
            else {
              SVar243 = SampledSpectrum::operator-(&sigma_maj);
              auVar166._0_8_ = SVar243.values.values._8_8_;
              auVar166._8_56_ = auVar132;
              auVar86._0_8_ = SVar243.values.values._0_8_;
              auVar86._8_56_ = auVar131;
              d.values.values = (array<float,_4>)vmovlhps_avx(auVar86._0_16_,auVar166._0_16_);
              auVar131 = (undefined1  [56])0x0;
              SVar243 = SampledSpectrum::operator*(&d,local_458 - (float)local_538._0_4_);
              auVar167._0_8_ = SVar243.values.values._8_8_;
              auVar167._8_56_ = auVar132;
              auVar87._0_8_ = SVar243.values.values._0_8_;
              auVar87._8_56_ = auVar131;
              Tmaj.values.values = (array<float,_4>)vmovlhps_avx(auVar87._0_16_,auVar167._0_16_);
              auVar131 = ZEXT856(Tmaj.values.values._8_8_);
              SVar243 = FastExp(&Tmaj);
              auVar168._0_8_ = SVar243.values.values._8_8_;
              auVar168._8_56_ = auVar132;
              auVar216 = auVar168._0_16_;
              auVar88._0_8_ = SVar243.values.values._0_8_;
              auVar88._8_56_ = auVar131;
              auVar39 = auVar88._0_16_;
            }
            bsdf._0_16_ = vmovlhps_avx(auVar39,auVar216);
            SampledSpectrum::operator*=(&TmajAccum,(SampledSpectrum *)&bsdf);
            FVar41 = local_3e8;
            auVar50 = ZEXT464((uint)tMax);
            in_ZMM1 = ZEXT464((uint)local_3e8);
            if ((tMax < local_3e8) ||
               (iVar28 = voxel[iVar27], voxel[iVar27] = iVar28 + step[iVar27],
               iVar28 + step[iVar27] == voxelLimit[iVar27])) break;
            local_538._0_4_ = local_458;
            nextCrossingT[iVar27] = FVar41 + deltaT[iVar27];
            uVar24 = (ulong)(uint)pDVar2->lambda_min;
            iVar28 = *piVar34;
          }
        }
        else {
          auVar50 = ZEXT464(0x3f800000);
          SampledSpectrum::SampledSpectrum((SampledSpectrum *)&bsdf,1.0);
        }
      }
      else {
        local_438.o.super_Tuple3<pbrt::Point3,_float>.x =
             (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
        local_438.o.super_Tuple3<pbrt::Point3,_float>.y =
             (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
        uVar130 = *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        auVar6._0_12_ = *(undefined1 (*) [12])&(ray->super_Ray).d;
        auVar6._12_4_ = (ray->super_Ray).time;
        auVar132 = ZEXT856(auVar6._8_8_);
        local_3a0._8_8_ = &L;
        local_3a0._0_8_ = &uMode;
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.y = auVar6._4_4_;
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar6._8_4_;
        local_438.o.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar130;
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar130 >> 0x20);
        local_3a0._16_8_ = &beta;
        local_3a0._32_8_ = &terminated;
        local_378 = &numScatters;
        local_370 = local_3f0;
        local_358 = &scattered;
        local_350 = &rng;
        local_438.time = (Float)auVar6._12_4_;
        local_438.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )TVar8.bits;
        tVar42 = Length<float>(&local_438.d);
        fVar43 = tVar42 * (float)local_538._0_4_;
        auVar131 = (undefined1  [56])0x0;
        local_538 = ZEXT416((uint)fVar43);
        bVar15 = ABS(fVar43) == INFINITY;
        VVar240 = Normalize<float>(&local_438.d);
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.z =
             VVar240.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar69._0_8_ = VVar240.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar69._8_56_ = auVar131;
        uVar130 = vmovlpd_avx(auVar69._0_16_);
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar130;
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar130 >> 0x20);
        auVar131 = (undefined1  [56])0x0;
        local_518._0_4_ = this_01[3].lambda_min;
        SVar243 = DenselySampledSpectrum::Sample(this_01,lambda);
        auVar153._0_8_ = SVar243.values.values._8_8_;
        auVar153._8_56_ = auVar132;
        auVar70._0_8_ = SVar243.values.values._0_8_;
        auVar70._8_56_ = auVar131;
        bsdf._0_16_ = vmovlhps_avx(auVar70._0_16_,auVar153._0_16_);
        auVar131 = (undefined1  [56])0x0;
        SVar243 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_518._0_4_);
        auVar154._0_8_ = SVar243.values.values._8_8_;
        auVar154._8_56_ = auVar132;
        auVar71._0_8_ = SVar243.values.values._0_8_;
        auVar71._8_56_ = auVar131;
        auVar39 = vmovlhps_avx(auVar71._0_16_,auVar154._0_16_);
        sigma_a_3.values.values._0_8_ = auVar39._0_8_;
        sigma_a_3.values.values[2] = auVar39._8_4_;
        sigma_a_3.values.values[3] = auVar39._12_4_;
        auVar131 = (undefined1  [56])0x0;
        local_518._0_4_ = this_01[3].lambda_min;
        SVar243 = DenselySampledSpectrum::Sample(this_01 + 1,lambda);
        auVar155._0_8_ = SVar243.values.values._8_8_;
        auVar155._8_56_ = auVar132;
        auVar72._0_8_ = SVar243.values.values._0_8_;
        auVar72._8_56_ = auVar131;
        bsdf._0_16_ = vmovlhps_avx(auVar72._0_16_,auVar155._0_16_);
        auVar131 = (undefined1  [56])0x0;
        local_538 = ZEXT416((uint)bVar15 * 0x7f7fffff + (uint)!bVar15 * local_538._0_4_);
        SVar243 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_518._0_4_);
        auVar156._0_8_ = SVar243.values.values._8_8_;
        auVar156._8_56_ = auVar132;
        auVar73._0_8_ = SVar243.values.values._0_8_;
        auVar73._8_56_ = auVar131;
        auVar39 = vmovlhps_avx(auVar73._0_16_,auVar156._0_16_);
        auVar131 = ZEXT856(auVar39._8_8_);
        sigma_s_3.values.values._0_8_ = auVar39._0_8_;
        sigma_s_3.values.values[2] = auVar39._8_4_;
        sigma_s_3.values.values[3] = auVar39._12_4_;
        SVar243 = SampledSpectrum::operator+(&sigma_a_3,&sigma_s_3);
        auVar157._0_8_ = SVar243.values.values._8_8_;
        auVar157._8_56_ = auVar132;
        auVar74._0_8_ = SVar243.values.values._0_8_;
        auVar74._8_56_ = auVar131;
        TmajAccum.values.values = (array<float,_4>)vmovlhps_avx(auVar74._0_16_,auVar157._0_16_);
        fVar43 = SVar243.values.values[0];
        if ((fVar43 != 0.0) || (NAN(fVar43))) {
          auVar131 = ZEXT856(auVar131._0_8_);
          auVar123._0_4_ = SampleExponential((Float)local_408._0_4_,fVar43);
          auVar123._4_60_ = extraout_var;
          if (local_538._0_4_ <= auVar123._0_4_) {
            auVar12._8_4_ = 0x80000000;
            auVar12._0_8_ = 0x8000000080000000;
            auVar12._12_4_ = 0x80000000;
            auVar39 = vxorps_avx512vl(local_538,auVar12);
            auVar132 = ZEXT856(auVar39._8_8_);
            SVar243 = SampledSpectrum::operator*(&TmajAccum,auVar39._0_4_);
            auVar210._0_8_ = SVar243.values.values._8_8_;
            auVar210._8_56_ = auVar131;
            auVar127._0_8_ = SVar243.values.values._0_8_;
            auVar127._8_56_ = auVar132;
            bsdf._0_16_ = vmovlhps_avx(auVar127._0_16_,auVar210._0_16_);
            auVar132 = ZEXT856(bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_);
            SVar243 = FastExp((SampledSpectrum *)&bsdf);
            in_ZMM1._0_8_ = SVar243.values.values._8_8_;
            in_ZMM1._8_56_ = auVar131;
            auVar50._0_8_ = SVar243.values.values._0_8_;
            auVar50._8_56_ = auVar132;
          }
          else {
            local_408 = auVar123._0_16_;
            auVar132 = ZEXT856(extraout_var._4_8_);
            auVar11._8_4_ = 0x80000000;
            auVar11._0_8_ = 0x8000000080000000;
            auVar11._12_4_ = 0x80000000;
            auVar39 = vxorps_avx512vl(local_408,auVar11);
            auVar131 = ZEXT856(auVar39._8_8_);
            SVar243 = SampledSpectrum::operator*(&TmajAccum,auVar39._0_4_);
            auVar206._0_8_ = SVar243.values.values._8_8_;
            auVar206._8_56_ = auVar132;
            auVar124._0_8_ = SVar243.values.values._0_8_;
            auVar124._8_56_ = auVar131;
            bsdf._0_16_ = vmovlhps_avx(auVar124._0_16_,auVar206._0_16_);
            uVar130 = bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_;
            SVar243 = FastExp((SampledSpectrum *)&bsdf);
            auVar207._0_8_ = SVar243.values.values._8_8_;
            auVar207._8_56_ = auVar132;
            local_538._8_8_ = uVar130;
            local_538._0_8_ = SVar243.values.values._0_8_;
            local_518 = auVar207._0_16_;
            local_458 = (float)this_01[3].lambda_max;
            auVar131 = (undefined1  [56])0x0;
            SVar243 = DenselySampledSpectrum::Sample(this_01 + 2,lambda);
            auVar208._0_8_ = SVar243.values.values._8_8_;
            auVar208._8_56_ = auVar132;
            auVar125._0_8_ = SVar243.values.values._0_8_;
            auVar125._8_56_ = auVar131;
            bsdf._0_16_ = vmovlhps_avx(auVar125._0_16_,auVar208._0_16_);
            uVar130 = 0;
            SVar243 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,local_458);
            auVar209._0_8_ = SVar243.values.values._8_8_;
            auVar209._8_56_ = auVar132;
            local_458 = SVar243.values.values[0];
            fStack_454 = SVar243.values.values[1];
            local_348 = auVar209._0_16_;
            auVar131 = ZEXT856((ulong)local_408._8_8_);
            uStack_450 = uVar130;
            PVar241 = Ray::operator()(&local_438,local_408._0_4_);
            auVar134._0_4_ = PVar241.super_Tuple3<pbrt::Point3,_float>.z;
            auVar126._0_8_ = PVar241.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar126._8_56_ = auVar131;
            bsdf._0_16_ = vshufps_avx(auVar126._0_16_,auVar126._0_16_,0x50);
            auVar134._4_4_ = auVar134._0_4_;
            auVar134._8_4_ = auVar134._0_4_;
            auVar134._12_4_ = auVar134._0_4_;
            in_ZMM1 = ZEXT1664(auVar134);
            auVar219._0_8_ =
                 CONCAT44(local_438.d.super_Tuple3<pbrt::Vector3,_float>.y,
                          local_438.d.super_Tuple3<pbrt::Vector3,_float>.x) ^ 0x8000000080000000;
            auVar219._8_4_ = 0x80000000;
            auVar219._12_4_ = 0x80000000;
            bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
                 -local_438.d.super_Tuple3<pbrt::Vector3,_float>.z;
            in_ZMM4 = ZEXT464((uint)local_438.time);
            bsdf.shadingFrame._20_16_ = ZEXT816(0) << 0x20;
            in_ZMM6 = ZEXT864(0) << 0x20;
            auVar13._4_4_ = fStack_454;
            auVar13._0_4_ = local_458;
            auVar13._8_8_ = uStack_450;
            bsdf._16_8_ = vmovlps_avx(auVar134);
            bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = local_438.time;
            bsdf.shadingFrame._8_8_ = vmovlps_avx(auVar219);
            vunpcklpd_avx(auVar13,local_348);
            local_240.values.values = (array<float,_4>)vunpcklpd_avx(local_538,local_518);
            Li::anon_class_88_11_08f5f5b0::operator()
                      ((anon_class_88_11_08f5f5b0 *)local_3a0,(MediumSample *)&bsdf);
            auVar50 = ZEXT464(0x3f800000);
            SampledSpectrum::SampledSpectrum((SampledSpectrum *)&bsdf,1.0);
          }
        }
        else {
          auVar10._8_4_ = 0x80000000;
          auVar10._0_8_ = 0x8000000080000000;
          auVar10._12_4_ = 0x80000000;
          auVar39 = vxorps_avx512vl(local_538,auVar10);
          auVar131 = ZEXT856(auVar39._8_8_);
          SVar243 = SampledSpectrum::operator*(&TmajAccum,auVar39._0_4_);
          auVar158._0_8_ = SVar243.values.values._8_8_;
          auVar158._8_56_ = auVar132;
          auVar75._0_8_ = SVar243.values.values._0_8_;
          auVar75._8_56_ = auVar131;
          bsdf._0_16_ = vmovlhps_avx(auVar75._0_16_,auVar158._0_16_);
          auVar131 = ZEXT856(bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_);
          SVar243 = FastExp((SampledSpectrum *)&bsdf);
          in_ZMM1._0_8_ = SVar243.values.values._8_8_;
          in_ZMM1._8_56_ = auVar132;
          auVar50._0_8_ = SVar243.values.values._0_8_;
          auVar50._8_56_ = auVar131;
        }
      }
    }
    else {
      local_348._0_8_ = this_01 + 3;
      if ((TVar8.bits & 0xfffe000000000000) == 0x2000000000000) {
        sigma_s_3.values.values[0] = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
        sigma_s_3.values.values[1] = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
        uVar130 = *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        auVar222._0_12_ = *(undefined1 (*) [12])&(ray->super_Ray).d;
        auVar222._12_4_ = (ray->super_Ray).time;
        auVar213 = ZEXT1260(auVar222._4_12_);
        local_3a0._8_8_ = &L;
        local_3a0._0_8_ = &uMode;
        sigma_s_3.values.values[2] = (float)uVar130;
        sigma_s_3.values.values[3] = (float)((ulong)uVar130 >> 0x20);
        local_3a0._16_8_ = &beta;
        local_3a0._32_8_ = &terminated;
        local_378 = &numScatters;
        local_370 = local_3f0;
        local_358 = &scattered;
        local_520 = (float)local_538._0_4_;
        local_350 = &rng;
        SampledSpectrum::SampledSpectrum(&TmajAccum,1.0);
        Transform::ApplyInverse
                  (&local_438,(Transform *)local_348._0_8_,(Ray *)&sigma_s_3,&local_520);
        tVar42 = Length<float>(&local_438.d);
        local_520 = tVar42 * local_520;
        auVar131 = (undefined1  [56])0x0;
        VVar240 = Normalize<float>(&local_438.d);
        in_ZMM1._0_4_ = VVar240.super_Tuple3<pbrt::Vector3,_float>.z;
        in_ZMM1._4_60_ = auVar213;
        auVar60._0_8_ = VVar240.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar60._8_56_ = auVar131;
        uVar130 = vmovlps_avx(auVar60._0_16_);
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar130;
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar130 >> 0x20);
        pvVar1 = &this_01->values;
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.z = in_ZMM1._0_4_;
        bVar15 = Bounds3<float>::IntersectP
                           ((Bounds3<float> *)pvVar1,&local_438.o,&local_438.d,local_520,&tMin,&tMax
                           );
        auVar239 = in_ZMM7._4_12_;
        auVar234 = in_ZMM6._4_12_;
        auVar223 = in_ZMM4._4_12_;
        auVar131 = in_ZMM1._8_56_;
        if (bVar15) {
          auVar132 = (undefined1  [56])0x0;
          local_538._0_4_ = *(Float *)&this_01[2].values.nStored;
          SVar243 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&(this_01->values).nStored,lambda);
          auVar147._0_8_ = SVar243.values.values._8_8_;
          auVar147._8_56_ = auVar131;
          auVar61._0_8_ = SVar243.values.values._0_8_;
          auVar61._8_56_ = auVar132;
          bsdf._0_16_ = vmovlhps_avx(auVar61._0_16_,auVar147._0_16_);
          auVar132 = (undefined1  [56])0x0;
          SVar243 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_538._0_4_);
          auVar148._0_8_ = SVar243.values.values._8_8_;
          auVar148._8_56_ = auVar131;
          auVar62._0_8_ = SVar243.values.values._0_8_;
          auVar62._8_56_ = auVar132;
          sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar62._0_16_,auVar148._0_16_);
          local_538._0_4_ = *(undefined4 *)&this_01[2].values.nStored;
          auVar132 = (undefined1  [56])0x0;
          SVar243 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&this_01[1].values.nStored,lambda);
          auVar149._0_8_ = SVar243.values.values._8_8_;
          auVar149._8_56_ = auVar131;
          auVar63._0_8_ = SVar243.values.values._0_8_;
          auVar63._8_56_ = auVar132;
          bsdf._0_16_ = vmovlhps_avx(auVar63._0_16_,auVar149._0_16_);
          auVar132 = (undefined1  [56])0x0;
          SVar243 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_538._0_4_);
          auVar150._0_8_ = SVar243.values.values._8_8_;
          auVar150._8_56_ = auVar131;
          auVar64._0_8_ = SVar243.values.values._0_8_;
          auVar64._8_56_ = auVar132;
          sigma_s.values.values = (array<float,_4>)vmovlhps_avx(auVar64._0_16_,auVar150._0_16_);
          auVar132 = ZEXT856(sigma_s.values.values._8_8_);
          SVar243 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
          auVar151._0_8_ = SVar243.values.values._8_8_;
          auVar151._8_56_ = auVar131;
          auVar65._0_8_ = SVar243.values.values._0_8_;
          auVar65._8_56_ = auVar132;
          sigma_t.values.values = (array<float,_4>)vmovlhps_avx(auVar65._0_16_,auVar151._0_16_);
          auVar131 = ZEXT856(sigma_t.values.values._8_8_);
          VVar240 = Bounds3<float>::Diagonal((Bounds3<float> *)pvVar1);
          auVar213 = auVar151._4_60_;
          local_538._0_4_ = VVar240.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar66._0_8_ = VVar240.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar66._8_56_ = auVar131;
          local_518 = auVar66._0_16_;
          VVar240 = Bounds3<float>::Offset((Bounds3<float> *)pvVar1,&local_438.o);
          sigma_a_3.values.values[2] = VVar240.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar67._0_8_ = VVar240.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar67._8_56_ = auVar131;
          auVar215._4_4_ = local_438.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar215._0_4_ = local_438.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar215._8_8_ = 0;
          sigma_a_3.values.values._0_8_ = vmovlps_avx(auVar67._0_16_);
          auVar131 = (undefined1  [56])0x0;
          auVar39 = vdivps_avx(auVar215,local_518);
          local_4ac = local_438.d.super_Tuple3<pbrt::Vector3,_float>.z / (float)local_538._0_4_;
          uVar130 = vmovlps_avx(auVar39);
          sigma_a_3.values.values[3] = (float)uVar130;
          fStack_4b0 = (float)((ulong)uVar130 >> 0x20);
          local_4a8 = 0.0;
          local_4a0.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )0;
          PVar241 = Ray::operator()((Ray *)&sigma_a_3,tMin);
          auVar152._0_4_ = PVar241.super_Tuple3<pbrt::Point3,_float>.z;
          auVar152._4_60_ = auVar213;
          auVar68._0_8_ = PVar241.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar68._8_56_ = auVar131;
          uVar7 = this_01[7].lambda_min;
          uVar24 = CONCAT44(0,uVar7);
          auVar216 = vmovshdup_avx(auVar68._0_16_);
          auVar227 = ZEXT816(0) << 0x40;
          pTVar3 = (Transform *)(this_01 + 7);
          lVar31 = 0;
          local_3f8 = (Transform *)&this_01[7].lambda_max;
          FVar41 = (Float)this_01[7].lambda_max;
          local_518._0_8_ = uVar24;
          fVar220 = (float)(int)FVar41;
          auVar226._0_4_ = (float)((int)FVar41 + -1);
          auVar226._4_12_ = auVar223;
          auVar40 = ZEXT416((uint)(auVar216._0_4_ * fVar220));
          auVar39 = vminss_avx(auVar226,auVar40);
          uVar130 = vcmpss_avx512f(auVar40,auVar227,1);
          fVar221 = (float)(int)uVar7;
          in_ZMM4 = ZEXT1664(CONCAT124(auVar234,fVar221));
          auVar232._0_4_ = (float)(int)(uVar7 - 1);
          auVar232._4_12_ = auVar234;
          iVar28 = *(int *)&this_01[7].values.alloc.memoryResource;
          iVar27 = (int)(float)((uint)!(bool)((byte)uVar130 & 1) * auVar39._0_4_);
          auVar40 = ZEXT416((uint)(PVar241.super_Tuple3<pbrt::Point3,_float>.x * fVar221));
          auVar39 = vminss_avx(auVar232,auVar40);
          uVar130 = vcmpss_avx512f(auVar40,auVar227,1);
          fVar224 = (float)iVar28;
          auVar237._0_4_ = (float)(iVar28 + -1);
          auVar237._4_12_ = auVar239;
          fVar43 = (float)((uint)!(bool)((byte)uVar130 & 1) * auVar39._0_4_);
          auVar38._4_12_ = auVar39._4_12_;
          auVar38._0_4_ = fVar43;
          iVar28 = (int)fVar43;
          auVar39 = vminss_avx(auVar237,ZEXT416((uint)(auVar152._0_4_ * fVar224)));
          uVar130 = vcmpss_avx512f(ZEXT416((uint)(auVar152._0_4_ * fVar224)),auVar227,1);
          iVar18 = (int)(float)((uint)!(bool)((byte)uVar130 & 1) * auVar39._0_4_);
          in_ZMM7 = ZEXT464((uint)tMin);
          local_538._0_4_ = tMin;
          while( true ) {
            in_ZMM6 = ZEXT1664(auVar38);
            if (lVar31 == 3) break;
            iVar29 = (int)lVar31;
            if (iVar29 == 1) {
              voxel[1] = iVar27;
              pFVar32 = (Float *)(voxelLimit + 1);
              piVar34 = step + 1;
              pFVar36 = deltaT + 1;
              pfVar21 = nextCrossingT + 1;
              pfVar26 = &fStack_4b0;
              iVar30 = iVar27;
            }
            else if (iVar29 == 0) {
              voxel[lVar31] = iVar28;
              pFVar32 = (Float *)voxelLimit;
              piVar34 = step;
              pFVar36 = deltaT;
              pfVar21 = nextCrossingT;
              pfVar26 = sigma_a_3.values.values + 3;
              iVar30 = iVar28;
            }
            else {
              pFVar32 = (Float *)(voxelLimit + 2);
              piVar34 = step + 2;
              pFVar36 = deltaT + 2;
              pfVar21 = nextCrossingT + 2;
              pfVar26 = &local_4ac;
              voxel[lVar31] = iVar18;
              iVar30 = iVar18;
            }
            if ((*pfVar26 == 0.0) && (!NAN(*pfVar26))) {
              pfVar26 = sigma_a_3.values.values + 3;
              if ((iVar29 != 0) && (pfVar26 = &fStack_4b0, iVar29 != 1)) {
                pfVar26 = &local_4ac;
              }
              *pfVar26 = 0.0;
            }
            pfVar26 = sigma_a_3.values.values + 3;
            if ((iVar29 != 0) && (pfVar26 = &fStack_4b0, iVar29 != 1)) {
              pfVar26 = &local_4ac;
            }
            if (0.0 <= *pfVar26) {
              pfVar26 = sigma_a_3.values.values + 3;
              pTVar25 = pTVar3;
              fVar43 = fVar221;
              fVar235 = PVar241.super_Tuple3<pbrt::Point3,_float>.x;
              if ((iVar29 != 0) &&
                 (pfVar26 = &fStack_4b0, pTVar25 = local_3f8, fVar43 = fVar220,
                 fVar235 = auVar216._0_4_, iVar29 != 1)) {
                pfVar26 = &local_4ac;
                pTVar25 = (Transform *)&this_01[7].values;
                fVar43 = fVar224;
                fVar235 = auVar152._0_4_;
              }
              *piVar34 = 1;
              fVar4 = *pfVar26;
              fVar235 = ((float)(iVar30 + 1) / fVar43 - fVar235) / fVar4 + tMin;
              in_ZMM7 = ZEXT464((uint)fVar235);
              *pfVar21 = fVar235;
              *pFVar36 = 1.0 / (fVar4 * fVar43);
              FVar23 = (pTVar25->m).m[0][0];
            }
            else {
              pfVar26 = sigma_a_3.values.values + 3;
              in_ZMM7 = ZEXT1664(auVar68._0_16_);
              pTVar25 = pTVar3;
              fVar43 = fVar221;
              if (iVar29 != 0) {
                pfVar26 = &fStack_4b0;
                in_ZMM7 = ZEXT1664(auVar216);
                pTVar25 = local_3f8;
                fVar43 = fVar220;
                if (iVar29 != 1) {
                  pfVar26 = &local_4ac;
                  in_ZMM7 = ZEXT1664(auVar152._0_16_);
                  pTVar25 = (Transform *)&this_01[7].values;
                  fVar43 = fVar224;
                }
              }
              fVar235 = *pfVar26;
              *pfVar21 = ((float)iVar30 / fVar43 - in_ZMM7._0_4_) / fVar235 + tMin;
              FVar23 = (pTVar25->m).m[0][0];
              *piVar34 = -1;
              *pFVar36 = -1.0 / (fVar235 * (float)(int)FVar23);
              FVar23 = -NAN;
            }
            auVar38 = ZEXT416(0);
            *pFVar32 = FVar23;
            lVar31 = lVar31 + 1;
          }
          auVar50 = ZEXT464((uint)tMax);
          while( true ) {
            iVar28 = *(int *)(&DAT_0053dd60 +
                             (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                    (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                    (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
            local_3e8 = nextCrossingT[iVar28];
            auVar132 = (undefined1  [56])0x0;
            auVar39 = vminss_avx(ZEXT416((uint)local_3e8),auVar50._0_16_);
            local_458 = auVar39._0_4_;
            auVar131 = (undefined1  [56])0x0;
            SVar243 = SampledSpectrum::operator*
                                (&sigma_t,this_01[6].values.ptr
                                          [(long)(((int)FVar41 * voxel[2] + voxel[1]) * (int)uVar24)
                                           + (long)voxel[0]]);
            auVar178._0_8_ = SVar243.values.values._8_8_;
            auVar178._8_56_ = auVar132;
            auVar97._0_8_ = SVar243.values.values._0_8_;
            auVar97._8_56_ = auVar131;
            auVar50 = ZEXT1664(auVar97._0_16_);
            sigma_maj.values.values = (array<float,_4>)vmovlhps_avx(auVar97._0_16_,auVar178._0_16_);
            auVar131 = ZEXT856(sigma_maj.values.values._8_8_);
            if ((SVar243.values.values[0] != 0.0) || (NAN(SVar243.values.values[0]))) {
              while( true ) {
                FVar41 = SampleExponential((Float)local_408._0_4_,auVar50._0_4_);
                local_518._0_4_ = FVar41;
                fVar43 = RNG::Uniform<float>(&rng);
                auVar216 = in_ZMM7._0_16_;
                auVar39 = in_ZMM6._0_16_;
                local_408._0_4_ = fVar43;
                auVar131 = (undefined1  [56])0x0;
                fVar43 = (float)local_518._0_4_ + (float)local_538._0_4_;
                auVar132 = (undefined1  [56])0x0;
                if (local_458 <= fVar43) break;
                auVar131 = (undefined1  [56])0x0;
                if (fVar43 < tMax) {
                  local_518._0_4_ = fVar43;
                  SVar243 = SampledSpectrum::operator-(&sigma_maj);
                  auVar182._0_8_ = SVar243.values.values._8_8_;
                  auVar182._8_56_ = auVar132;
                  auVar101._0_8_ = SVar243.values.values._0_8_;
                  auVar101._8_56_ = auVar131;
                  d.values.values = (array<float,_4>)vmovlhps_avx(auVar101._0_16_,auVar182._0_16_);
                  auVar131 = (undefined1  [56])0x0;
                  SVar243 = SampledSpectrum::operator*
                                      (&d,(float)local_518._0_4_ - (float)local_538._0_4_);
                  auVar183._0_8_ = SVar243.values.values._8_8_;
                  auVar183._8_56_ = auVar132;
                  auVar102._0_8_ = SVar243.values.values._0_8_;
                  auVar102._8_56_ = auVar131;
                  bsdf._0_16_ = vmovlhps_avx(auVar102._0_16_,auVar183._0_16_);
                  auVar131 = ZEXT856(bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_);
                  SVar243 = FastExp((SampledSpectrum *)&bsdf);
                  auVar184._0_8_ = SVar243.values.values._8_8_;
                  auVar184._8_56_ = auVar132;
                  auVar103._0_8_ = SVar243.values.values._0_8_;
                  auVar103._8_56_ = auVar131;
                  Tmaj.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar103._0_16_,auVar184._0_16_);
                  auVar131 = (undefined1  [56])0x0;
                  PVar241 = Ray::operator()(&local_438,(Float)local_518._0_4_);
                  local_488.z = PVar241.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar104._0_8_ = PVar241.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  auVar104._8_56_ = auVar131;
                  local_488._0_8_ = vmovlps_avx(auVar104._0_16_);
                  SVar243 = CloudMediumProvider::Density
                                      (*(CloudMediumProvider **)this_01,PVar241,lambda);
                  auVar185._0_8_ = SVar243.values.values._8_8_;
                  auVar185._8_56_ = auVar132;
                  auVar105._0_8_ = SVar243.values.values._0_8_;
                  auVar105._8_56_ = auVar131;
                  d.values.values = (array<float,_4>)vmovlhps_avx(auVar105._0_16_,auVar185._0_16_);
                  PVar241.super_Tuple3<pbrt::Point3,_float>.z = local_488.z;
                  PVar241.super_Tuple3<pbrt::Point3,_float>.x = local_488.x;
                  PVar241.super_Tuple3<pbrt::Point3,_float>.y = local_488.y;
                  auVar131 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                  local_1d8._8_8_ = 0;
                  uVar130 = 0;
                  uVar133 = 0;
                  SVar243 = CloudMediumProvider::Le(*(CloudMediumProvider **)this_01,PVar241,lambda)
                  ;
                  local_158 = SVar243.values.values._8_8_;
                  local_538._8_8_ = local_1d8._8_8_;
                  local_538._0_8_ = SVar243.values.values._0_8_;
                  uStack_150 = auVar131._0_8_;
                  SVar243 = SampledSpectrum::operator*(&sigma_a,&d);
                  auVar186._0_8_ = SVar243.values.values._8_8_;
                  auVar186._8_56_ = auVar131;
                  local_178 = SVar243.values.values._0_8_;
                  auVar131 = ZEXT856(auVar131._0_8_);
                  uStack_170 = local_1d8._8_8_;
                  uStack_168 = uVar130;
                  uStack_160 = uVar133;
                  SVar243 = SampledSpectrum::operator*(&sigma_s,&d);
                  auVar187._0_8_ = SVar243.values.values._8_8_;
                  auVar187._8_56_ = auVar131;
                  local_1d8._0_8_ = SVar243.values.values._0_8_;
                  SampledSpectrum::operator*=(&Tmaj,&TmajAccum);
                  SampledSpectrum::SampledSpectrum((SampledSpectrum *)&bsdf,1.0);
                  TmajAccum.values.values = (array<float,_4>)(array<float,_4>)bsdf._0_16_;
                  uVar24 = bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_;
                  PVar242 = Transform::operator()
                                      ((Transform *)local_348._0_8_,(Point3<float> *)&local_488);
                  fVar43 = PVar242.super_Tuple3<pbrt::Point3,_float>.z;
                  local_1f8._8_8_ = uVar24;
                  local_1f8._0_8_ = PVar242.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  VVar240 = Normalize<float>((Vector3<float> *)(sigma_s_3.values.values + 3));
                  auVar218._8_4_ = 0x80000000;
                  auVar218._0_8_ = 0x8000000080000000;
                  auVar218._12_4_ = 0x80000000;
                  auVar229._4_4_ = fVar43;
                  auVar229._0_4_ = fVar43;
                  auVar229._8_4_ = fVar43;
                  auVar229._12_4_ = fVar43;
                  bsdf.shadingFrame._20_16_ = ZEXT816(0);
                  auVar45._0_8_ =
                       VVar240.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  auVar45._8_8_ = uVar24 ^ auVar218._8_8_;
                  bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
                       -VVar240.super_Tuple3<pbrt::Vector3,_float>.z;
                  bsdf._0_16_ = vpermilps_avx(local_1f8,0x50);
                  bsdf._16_8_ = vmovlps_avx(auVar229);
                  bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar222._12_4_;
                  bsdf.shadingFrame._8_8_ = vmovlpd_avx(auVar45);
                  auVar48._16_16_ = auVar187._0_16_;
                  auVar48._0_16_ = auVar45;
                  auVar137._16_16_ = auVar186._0_16_;
                  auVar137._0_16_ = auVar45;
                  auVar49 = vperm2f128_avx(auVar137,auVar48,0x31);
                  auVar138._8_8_ = uStack_170;
                  auVar138._0_8_ = local_178;
                  auVar138._16_16_ = local_1d8;
                  vunpcklpd_avx(auVar138,auVar49);
                  auVar14._8_8_ = uStack_150;
                  auVar14._0_8_ = local_158;
                  vunpcklpd_avx(local_538,auVar14);
                  *(array<float,_4> *)(local_230->values).values = Tmaj.values.values;
                  in_ZMM1 = ZEXT1664((undefined1  [16])Tmaj.values.values);
                  in_ZMM4 = ZEXT1664((undefined1  [16])bsdf._0_16_);
                  in_ZMM6 = ZEXT1664(auVar39);
                  in_ZMM7 = ZEXT1664(auVar216);
                  bVar15 = Li::anon_class_88_11_08f5f5b0::operator()
                                     ((anon_class_88_11_08f5f5b0 *)local_3a0,(MediumSample *)&bsdf);
                  if (!bVar15) goto LAB_00413e8c;
                  fVar43 = (float)local_518._0_4_;
                }
                auVar50 = ZEXT464((uint)sigma_maj.values.values[0]);
                local_538._0_4_ = fVar43;
              }
              SVar243 = SampledSpectrum::operator-(&sigma_maj);
              auVar188._0_8_ = SVar243.values.values._8_8_;
              auVar188._8_56_ = auVar132;
              auVar106._0_8_ = SVar243.values.values._0_8_;
              auVar106._8_56_ = auVar131;
              d.values.values = (array<float,_4>)vmovlhps_avx(auVar106._0_16_,auVar188._0_16_);
              auVar131 = (undefined1  [56])0x0;
              SVar243 = SampledSpectrum::operator*(&d,local_458 - (float)local_538._0_4_);
              auVar189._0_8_ = SVar243.values.values._8_8_;
              auVar189._8_56_ = auVar132;
              auVar107._0_8_ = SVar243.values.values._0_8_;
              auVar107._8_56_ = auVar131;
              Tmaj.values.values = (array<float,_4>)vmovlhps_avx(auVar107._0_16_,auVar189._0_16_);
              auVar131 = ZEXT856(Tmaj.values.values._8_8_);
              SVar243 = FastExp(&Tmaj);
              auVar190._0_8_ = SVar243.values.values._8_8_;
              auVar190._8_56_ = auVar132;
              auVar216 = auVar190._0_16_;
              auVar108._0_8_ = SVar243.values.values._0_8_;
              auVar108._8_56_ = auVar131;
              auVar39 = auVar108._0_16_;
            }
            else {
              SVar243 = SampledSpectrum::operator-(&sigma_maj);
              auVar179._0_8_ = SVar243.values.values._8_8_;
              auVar179._8_56_ = auVar132;
              auVar98._0_8_ = SVar243.values.values._0_8_;
              auVar98._8_56_ = auVar131;
              d.values.values = (array<float,_4>)vmovlhps_avx(auVar98._0_16_,auVar179._0_16_);
              auVar131 = (undefined1  [56])0x0;
              SVar243 = SampledSpectrum::operator*(&d,local_458 - (float)local_538._0_4_);
              auVar180._0_8_ = SVar243.values.values._8_8_;
              auVar180._8_56_ = auVar132;
              auVar99._0_8_ = SVar243.values.values._0_8_;
              auVar99._8_56_ = auVar131;
              Tmaj.values.values = (array<float,_4>)vmovlhps_avx(auVar99._0_16_,auVar180._0_16_);
              auVar131 = ZEXT856(Tmaj.values.values._8_8_);
              SVar243 = FastExp(&Tmaj);
              auVar181._0_8_ = SVar243.values.values._8_8_;
              auVar181._8_56_ = auVar132;
              auVar216 = auVar181._0_16_;
              auVar100._0_8_ = SVar243.values.values._0_8_;
              auVar100._8_56_ = auVar131;
              auVar39 = auVar100._0_16_;
            }
            bsdf._0_16_ = vmovlhps_avx(auVar39,auVar216);
            SampledSpectrum::operator*=(&TmajAccum,(SampledSpectrum *)&bsdf);
            FVar41 = local_3e8;
            auVar50 = ZEXT464((uint)tMax);
            in_ZMM1 = ZEXT464((uint)local_3e8);
            if ((tMax < local_3e8) ||
               (iVar27 = voxel[iVar28], voxel[iVar28] = iVar27 + step[iVar28], pTVar25 = local_3f8,
               iVar27 + step[iVar28] == voxelLimit[iVar28])) break;
            local_538._0_4_ = local_458;
            nextCrossingT[iVar28] = FVar41 + deltaT[iVar28];
            uVar24 = (ulong)(uint)(pTVar3->m).m[0][0];
            FVar41 = (pTVar25->m).m[0][0];
          }
        }
        else {
          auVar50 = ZEXT464(0x3f800000);
          SampledSpectrum::SampledSpectrum((SampledSpectrum *)&bsdf,1.0);
        }
      }
      else {
        sigma_s_3.values.values[0] = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
        sigma_s_3.values.values[1] = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
        uVar130 = *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        auVar39._0_12_ = *(undefined1 (*) [12])&(ray->super_Ray).d;
        auVar39._12_4_ = (ray->super_Ray).time;
        auVar213 = ZEXT1260(auVar39._4_12_);
        local_3a0._8_8_ = &L;
        local_3a0._0_8_ = &uMode;
        sigma_s_3.values.values[2] = (float)uVar130;
        sigma_s_3.values.values[3] = (float)((ulong)uVar130 >> 0x20);
        local_3a0._16_8_ = &beta;
        local_3a0._32_8_ = &terminated;
        local_378 = &numScatters;
        local_370 = local_3f0;
        local_358 = &scattered;
        local_520 = (float)local_538._0_4_;
        local_350 = &rng;
        SampledSpectrum::SampledSpectrum(&TmajAccum,1.0);
        Transform::ApplyInverse
                  (&local_438,(Transform *)local_348._0_8_,(Ray *)&sigma_s_3,&local_520);
        tVar42 = Length<float>(&local_438.d);
        local_520 = tVar42 * local_520;
        auVar131 = (undefined1  [56])0x0;
        VVar240 = Normalize<float>(&local_438.d);
        in_ZMM1._0_4_ = VVar240.super_Tuple3<pbrt::Vector3,_float>.z;
        in_ZMM1._4_60_ = auVar213;
        auVar76._0_8_ = VVar240.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar76._8_56_ = auVar131;
        uVar130 = vmovlps_avx(auVar76._0_16_);
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar130;
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar130 >> 0x20);
        pvVar1 = &this_01->values;
        local_438.d.super_Tuple3<pbrt::Vector3,_float>.z = in_ZMM1._0_4_;
        bVar15 = Bounds3<float>::IntersectP
                           ((Bounds3<float> *)pvVar1,&local_438.o,&local_438.d,local_520,&tMin,&tMax
                           );
        auVar234 = in_ZMM7._4_12_;
        auVar223 = in_ZMM4._4_12_;
        auVar131 = in_ZMM1._8_56_;
        if (bVar15) {
          auVar132 = (undefined1  [56])0x0;
          local_538._0_4_ = *(Float *)&this_01[2].values.nStored;
          SVar243 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&(this_01->values).nStored,lambda);
          auVar159._0_8_ = SVar243.values.values._8_8_;
          auVar159._8_56_ = auVar131;
          auVar77._0_8_ = SVar243.values.values._0_8_;
          auVar77._8_56_ = auVar132;
          bsdf._0_16_ = vmovlhps_avx(auVar77._0_16_,auVar159._0_16_);
          auVar132 = (undefined1  [56])0x0;
          SVar243 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_538._0_4_);
          auVar160._0_8_ = SVar243.values.values._8_8_;
          auVar160._8_56_ = auVar131;
          auVar78._0_8_ = SVar243.values.values._0_8_;
          auVar78._8_56_ = auVar132;
          sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar78._0_16_,auVar160._0_16_);
          local_538._0_4_ = *(undefined4 *)&this_01[2].values.nStored;
          auVar132 = (undefined1  [56])0x0;
          SVar243 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&this_01[1].values.nStored,lambda);
          auVar161._0_8_ = SVar243.values.values._8_8_;
          auVar161._8_56_ = auVar131;
          auVar79._0_8_ = SVar243.values.values._0_8_;
          auVar79._8_56_ = auVar132;
          bsdf._0_16_ = vmovlhps_avx(auVar79._0_16_,auVar161._0_16_);
          auVar132 = (undefined1  [56])0x0;
          SVar243 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,(Float)local_538._0_4_);
          auVar162._0_8_ = SVar243.values.values._8_8_;
          auVar162._8_56_ = auVar131;
          auVar80._0_8_ = SVar243.values.values._0_8_;
          auVar80._8_56_ = auVar132;
          sigma_s.values.values = (array<float,_4>)vmovlhps_avx(auVar80._0_16_,auVar162._0_16_);
          auVar132 = ZEXT856(sigma_s.values.values._8_8_);
          SVar243 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
          auVar163._0_8_ = SVar243.values.values._8_8_;
          auVar163._8_56_ = auVar131;
          auVar81._0_8_ = SVar243.values.values._0_8_;
          auVar81._8_56_ = auVar132;
          sigma_t.values.values = (array<float,_4>)vmovlhps_avx(auVar81._0_16_,auVar163._0_16_);
          auVar131 = ZEXT856(sigma_t.values.values._8_8_);
          VVar240 = Bounds3<float>::Diagonal((Bounds3<float> *)pvVar1);
          auVar213 = auVar163._4_60_;
          local_538._0_4_ = VVar240.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar82._0_8_ = VVar240.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar82._8_56_ = auVar131;
          local_518 = auVar82._0_16_;
          VVar240 = Bounds3<float>::Offset((Bounds3<float> *)pvVar1,&local_438.o);
          sigma_a_3.values.values[2] = VVar240.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar83._0_8_ = VVar240.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar83._8_56_ = auVar131;
          auVar216._4_4_ = local_438.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar216._0_4_ = local_438.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar216._8_8_ = 0;
          sigma_a_3.values.values._0_8_ = vmovlps_avx(auVar83._0_16_);
          auVar131 = (undefined1  [56])0x0;
          auVar216 = vdivps_avx(auVar216,local_518);
          local_4ac = local_438.d.super_Tuple3<pbrt::Vector3,_float>.z / (float)local_538._0_4_;
          uVar130 = vmovlps_avx(auVar216);
          sigma_a_3.values.values[3] = (float)uVar130;
          fStack_4b0 = (float)((ulong)uVar130 >> 0x20);
          local_4a8 = 0.0;
          local_4a0.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )0;
          PVar241 = Ray::operator()((Ray *)&sigma_a_3,tMin);
          auVar164._0_4_ = PVar241.super_Tuple3<pbrt::Point3,_float>.z;
          auVar164._4_60_ = auVar213;
          auVar84._0_8_ = PVar241.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar84._8_56_ = auVar131;
          piVar34 = &this_01[7].lambda_max;
          uVar7 = this_01[7].lambda_min;
          uVar24 = CONCAT44(0,uVar7);
          auVar222 = vmovshdup_avx(auVar84._0_16_);
          auVar46 = ZEXT816(0) << 0x40;
          pDVar2 = this_01 + 7;
          lVar31 = 0;
          iVar28 = this_01[7].lambda_max;
          local_518._0_8_ = uVar24;
          fVar220 = (float)iVar28;
          auVar227._0_4_ = (float)(iVar28 + -1);
          auVar227._4_12_ = auVar223;
          auVar233._0_4_ = (float)(int)(uVar7 - 1);
          auVar233._4_12_ = auVar223;
          iVar27 = *(int *)&this_01[7].values.alloc.memoryResource;
          auVar40 = ZEXT416((uint)(auVar222._0_4_ * fVar220));
          auVar216 = vminss_avx(auVar227,auVar40);
          uVar130 = vcmpss_avx512f(auVar40,auVar46,1);
          fVar221 = (float)(int)uVar7;
          in_ZMM4 = ZEXT1664(CONCAT124(auVar234,fVar221));
          iVar18 = (int)(float)((uint)!(bool)((byte)uVar130 & 1) * auVar216._0_4_);
          auVar40 = ZEXT416((uint)(PVar241.super_Tuple3<pbrt::Point3,_float>.x * fVar221));
          auVar216 = vminss_avx(auVar233,auVar40);
          uVar130 = vcmpss_avx512f(auVar40,auVar46,1);
          fVar224 = (float)iVar27;
          auVar238._0_4_ = (float)(iVar27 + -1);
          auVar238._4_12_ = auVar234;
          fVar43 = (float)((uint)!(bool)((byte)uVar130 & 1) * auVar216._0_4_);
          auVar40._4_12_ = auVar216._4_12_;
          auVar40._0_4_ = fVar43;
          iVar27 = (int)fVar43;
          auVar216 = vminss_avx(auVar238,ZEXT416((uint)(auVar164._0_4_ * fVar224)));
          uVar130 = vcmpss_avx512f(ZEXT416((uint)(auVar164._0_4_ * fVar224)),auVar46,1);
          iVar29 = (int)(float)((uint)!(bool)((byte)uVar130 & 1) * auVar216._0_4_);
          in_ZMM7 = ZEXT464((uint)tMin);
          local_538._0_4_ = tMin;
          while( true ) {
            in_ZMM6 = ZEXT1664(auVar40);
            pfVar21 = sigma_a_3.values.values + 3;
            if (lVar31 == 3) break;
            iVar30 = (int)lVar31;
            if (iVar30 == 1) {
              voxel[1] = iVar18;
              piVar33 = voxelLimit + 1;
              piVar35 = step + 1;
              pFVar32 = deltaT + 1;
              pfVar26 = nextCrossingT + 1;
              pfVar19 = &fStack_4b0;
              iVar22 = iVar18;
            }
            else if (iVar30 == 0) {
              voxel[lVar31] = iVar27;
              piVar33 = voxelLimit;
              piVar35 = step;
              pFVar32 = deltaT;
              pfVar26 = nextCrossingT;
              pfVar19 = pfVar21;
              iVar22 = iVar27;
            }
            else {
              piVar33 = voxelLimit + 2;
              piVar35 = step + 2;
              pFVar32 = deltaT + 2;
              pfVar26 = nextCrossingT + 2;
              pfVar19 = &local_4ac;
              voxel[lVar31] = iVar29;
              iVar22 = iVar29;
            }
            if ((*pfVar19 == 0.0) && (!NAN(*pfVar19))) {
              pfVar19 = pfVar21;
              if ((iVar30 != 0) && (pfVar19 = &fStack_4b0, iVar30 != 1)) {
                pfVar19 = &local_4ac;
              }
              *pfVar19 = 0.0;
            }
            pfVar19 = pfVar21;
            if ((iVar30 != 0) && (pfVar19 = &fStack_4b0, iVar30 != 1)) {
              pfVar19 = &local_4ac;
            }
            if (0.0 <= *pfVar19) {
              pDVar20 = pDVar2;
              fVar43 = fVar221;
              fVar235 = PVar241.super_Tuple3<pbrt::Point3,_float>.x;
              if ((iVar30 != 0) &&
                 (pfVar21 = &fStack_4b0, pDVar20 = (DenselySampledSpectrum *)piVar34,
                 fVar43 = fVar220, fVar235 = auVar222._0_4_, iVar30 != 1)) {
                pfVar21 = &local_4ac;
                pDVar20 = (DenselySampledSpectrum *)&this_01[7].values;
                fVar43 = fVar224;
                fVar235 = auVar164._0_4_;
              }
              *piVar35 = 1;
              fVar4 = *pfVar21;
              fVar235 = ((float)(iVar22 + 1) / fVar43 - fVar235) / fVar4 + tMin;
              in_ZMM7 = ZEXT464((uint)fVar235);
              *pfVar26 = fVar235;
              *pFVar32 = 1.0 / (fVar4 * fVar43);
              iVar30 = pDVar20->lambda_min;
            }
            else {
              in_ZMM7 = ZEXT1664(auVar84._0_16_);
              pDVar20 = pDVar2;
              fVar43 = fVar221;
              if (iVar30 != 0) {
                pfVar21 = &fStack_4b0;
                in_ZMM7 = ZEXT1664(auVar222);
                pDVar20 = (DenselySampledSpectrum *)piVar34;
                fVar43 = fVar220;
                if (iVar30 != 1) {
                  pfVar21 = &local_4ac;
                  in_ZMM7 = ZEXT1664(auVar164._0_16_);
                  pDVar20 = (DenselySampledSpectrum *)&this_01[7].values;
                  fVar43 = fVar224;
                }
              }
              fVar235 = *pfVar21;
              *pfVar26 = ((float)iVar22 / fVar43 - in_ZMM7._0_4_) / fVar235 + tMin;
              iVar30 = pDVar20->lambda_min;
              *piVar35 = -1;
              *pFVar32 = -1.0 / (fVar235 * (float)iVar30);
              iVar30 = -1;
            }
            auVar40 = ZEXT416(0);
            *piVar33 = iVar30;
            lVar31 = lVar31 + 1;
          }
          auVar50 = ZEXT464((uint)tMax);
          while( true ) {
            iVar27 = *(int *)(&DAT_0053dd60 +
                             (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                    (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                    (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
            auVar132 = (undefined1  [56])0x0;
            auVar216 = vminss_avx(ZEXT416((uint)nextCrossingT[iVar27]),auVar50._0_16_);
            local_3f8 = (Transform *)CONCAT44(local_3f8._4_4_,nextCrossingT[iVar27]);
            local_458 = auVar216._0_4_;
            auVar131 = (undefined1  [56])0x0;
            SVar243 = SampledSpectrum::operator*
                                (&sigma_t,this_01[6].values.ptr
                                          [(long)((iVar28 * voxel[2] + voxel[1]) * (int)uVar24) +
                                           (long)voxel[0]]);
            auVar191._0_8_ = SVar243.values.values._8_8_;
            auVar191._8_56_ = auVar132;
            auVar109._0_8_ = SVar243.values.values._0_8_;
            auVar109._8_56_ = auVar131;
            auVar50 = ZEXT1664(auVar109._0_16_);
            sigma_maj.values.values = (array<float,_4>)vmovlhps_avx(auVar109._0_16_,auVar191._0_16_)
            ;
            auVar131 = ZEXT856(sigma_maj.values.values._8_8_);
            if ((SVar243.values.values[0] != 0.0) || (NAN(SVar243.values.values[0]))) {
              while( true ) {
                FVar41 = SampleExponential((Float)local_408._0_4_,auVar50._0_4_);
                local_518._0_4_ = FVar41;
                fVar43 = RNG::Uniform<float>(&rng);
                auVar222 = in_ZMM7._0_16_;
                auVar216 = in_ZMM6._0_16_;
                local_408._0_4_ = fVar43;
                auVar131 = (undefined1  [56])0x0;
                fVar43 = (float)local_518._0_4_ + (float)local_538._0_4_;
                auVar132 = (undefined1  [56])0x0;
                if (local_458 <= fVar43) break;
                auVar131 = (undefined1  [56])0x0;
                if (fVar43 < tMax) {
                  local_518._0_4_ = fVar43;
                  SVar243 = SampledSpectrum::operator-(&sigma_maj);
                  auVar195._0_8_ = SVar243.values.values._8_8_;
                  auVar195._8_56_ = auVar132;
                  auVar113._0_8_ = SVar243.values.values._0_8_;
                  auVar113._8_56_ = auVar131;
                  d.values.values = (array<float,_4>)vmovlhps_avx(auVar113._0_16_,auVar195._0_16_);
                  auVar131 = (undefined1  [56])0x0;
                  SVar243 = SampledSpectrum::operator*
                                      (&d,(float)local_518._0_4_ - (float)local_538._0_4_);
                  auVar196._0_8_ = SVar243.values.values._8_8_;
                  auVar196._8_56_ = auVar132;
                  auVar114._0_8_ = SVar243.values.values._0_8_;
                  auVar114._8_56_ = auVar131;
                  bsdf._0_16_ = vmovlhps_avx(auVar114._0_16_,auVar196._0_16_);
                  auVar131 = ZEXT856(bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_);
                  SVar243 = FastExp((SampledSpectrum *)&bsdf);
                  auVar197._0_8_ = SVar243.values.values._8_8_;
                  auVar197._8_56_ = auVar132;
                  auVar115._0_8_ = SVar243.values.values._0_8_;
                  auVar115._8_56_ = auVar131;
                  Tmaj.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar115._0_16_,auVar197._0_16_);
                  auVar131 = (undefined1  [56])0x0;
                  PVar241 = Ray::operator()(&local_438,(Float)local_518._0_4_);
                  local_488.z = PVar241.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar116._0_8_ = PVar241.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  auVar116._8_56_ = auVar131;
                  local_488._0_8_ = vmovlps_avx(auVar116._0_16_);
                  SVar243 = NanoVDBMediumProvider::Density
                                      (*(NanoVDBMediumProvider **)this_01,(Point3f *)&local_488,
                                       lambda);
                  auVar198._0_8_ = SVar243.values.values._8_8_;
                  auVar198._8_56_ = auVar132;
                  auVar117._0_8_ = SVar243.values.values._0_8_;
                  auVar117._8_56_ = auVar131;
                  d.values.values = (array<float,_4>)vmovlhps_avx(auVar117._0_16_,auVar198._0_16_);
                  local_1c8._8_8_ = d.values.values._8_8_;
                  uVar130 = 0;
                  uVar133 = 0;
                  SVar243 = NanoVDBMediumProvider::Le
                                      (*(NanoVDBMediumProvider **)this_01,(Point3f *)&local_488,
                                       lambda);
                  auVar199._0_8_ = SVar243.values.values._8_8_;
                  auVar199._8_56_ = auVar132;
                  local_538._8_8_ = local_1c8._8_8_;
                  local_538._0_8_ = SVar243.values.values._0_8_;
                  uVar24 = auVar132._0_8_;
                  SVar243 = SampledSpectrum::operator*(&sigma_a,&d);
                  uStack_170 = uVar24;
                  local_178 = SVar243.values.values._8_8_;
                  local_158 = SVar243.values.values._0_8_;
                  auVar131 = ZEXT856(uStack_170);
                  uStack_150 = local_1c8._8_8_;
                  uStack_148 = uVar130;
                  uStack_140 = uVar133;
                  SVar243 = SampledSpectrum::operator*(&sigma_s,&d);
                  auVar200._0_8_ = SVar243.values.values._8_8_;
                  auVar200._8_56_ = auVar131;
                  local_1c8._0_8_ = SVar243.values.values._0_8_;
                  SampledSpectrum::operator*=(&Tmaj,&TmajAccum);
                  SampledSpectrum::SampledSpectrum((SampledSpectrum *)&bsdf,1.0);
                  TmajAccum.values.values = (array<float,_4>)(array<float,_4>)bsdf._0_16_;
                  uVar130 = bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_;
                  PVar242 = Transform::operator()
                                      ((Transform *)local_348._0_8_,(Point3<float> *)&local_488);
                  fVar43 = PVar242.super_Tuple3<pbrt::Point3,_float>.z;
                  local_1e8._8_4_ = (float)uVar130;
                  local_1e8._12_4_ = SUB84(uVar130,4);
                  local_1e8._0_8_ = PVar242.super_Tuple3<pbrt::Point3,_float>._0_8_;
                  VVar240 = Normalize<float>((Vector3<float> *)(sigma_s_3.values.values + 3));
                  auVar230._4_4_ = fVar43;
                  auVar230._0_4_ = fVar43;
                  auVar230._8_4_ = fVar43;
                  auVar230._12_4_ = fVar43;
                  bsdf.shadingFrame._20_16_ = ZEXT816(0);
                  auVar46._0_8_ =
                       VVar240.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  auVar46._8_4_ = -(float)uVar130;
                  auVar46._12_4_ = -SUB84(uVar130,4);
                  bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y =
                       -VVar240.super_Tuple3<pbrt::Vector3,_float>.z;
                  bsdf._0_16_ = vpermilps_avx(local_1e8,0x50);
                  bsdf._16_8_ = vmovlps_avx(auVar230);
                  bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar39._12_4_;
                  bsdf.shadingFrame._8_8_ = vmovlps_avx(auVar46);
                  auVar49._16_16_ = auVar200._0_16_;
                  auVar49._0_16_ = auVar46;
                  auVar139._24_8_ = uStack_170;
                  auVar139._16_8_ = local_178;
                  auVar139._0_16_ = auVar46;
                  auVar49 = vperm2f128_avx(auVar139,auVar49,0x31);
                  auVar140._8_8_ = uStack_150;
                  auVar140._0_8_ = local_158;
                  auVar140._16_16_ = local_1c8;
                  vunpcklpd_avx(auVar140,auVar49);
                  vunpcklpd_avx(local_538,auVar199._0_16_);
                  *(array<float,_4> *)(local_230->values).values = Tmaj.values.values;
                  in_ZMM1 = ZEXT1664((undefined1  [16])Tmaj.values.values);
                  in_ZMM4 = ZEXT1664((undefined1  [16])bsdf._0_16_);
                  in_ZMM6 = ZEXT1664(auVar216);
                  in_ZMM7 = ZEXT1664(auVar222);
                  bVar15 = Li::anon_class_88_11_08f5f5b0::operator()
                                     ((anon_class_88_11_08f5f5b0 *)local_3a0,(MediumSample *)&bsdf);
                  if (!bVar15) goto LAB_00413e8c;
                  fVar43 = (float)local_518._0_4_;
                }
                auVar50 = ZEXT464((uint)sigma_maj.values.values[0]);
                local_538._0_4_ = fVar43;
              }
              SVar243 = SampledSpectrum::operator-(&sigma_maj);
              auVar201._0_8_ = SVar243.values.values._8_8_;
              auVar201._8_56_ = auVar132;
              auVar118._0_8_ = SVar243.values.values._0_8_;
              auVar118._8_56_ = auVar131;
              d.values.values = (array<float,_4>)vmovlhps_avx(auVar118._0_16_,auVar201._0_16_);
              auVar131 = (undefined1  [56])0x0;
              SVar243 = SampledSpectrum::operator*(&d,local_458 - (float)local_538._0_4_);
              auVar202._0_8_ = SVar243.values.values._8_8_;
              auVar202._8_56_ = auVar132;
              auVar119._0_8_ = SVar243.values.values._0_8_;
              auVar119._8_56_ = auVar131;
              Tmaj.values.values = (array<float,_4>)vmovlhps_avx(auVar119._0_16_,auVar202._0_16_);
              auVar131 = ZEXT856(Tmaj.values.values._8_8_);
              SVar243 = FastExp(&Tmaj);
              auVar203._0_8_ = SVar243.values.values._8_8_;
              auVar203._8_56_ = auVar132;
              auVar222 = auVar203._0_16_;
              auVar120._0_8_ = SVar243.values.values._0_8_;
              auVar120._8_56_ = auVar131;
              auVar216 = auVar120._0_16_;
            }
            else {
              SVar243 = SampledSpectrum::operator-(&sigma_maj);
              auVar192._0_8_ = SVar243.values.values._8_8_;
              auVar192._8_56_ = auVar132;
              auVar110._0_8_ = SVar243.values.values._0_8_;
              auVar110._8_56_ = auVar131;
              d.values.values = (array<float,_4>)vmovlhps_avx(auVar110._0_16_,auVar192._0_16_);
              auVar131 = (undefined1  [56])0x0;
              SVar243 = SampledSpectrum::operator*(&d,local_458 - (float)local_538._0_4_);
              auVar193._0_8_ = SVar243.values.values._8_8_;
              auVar193._8_56_ = auVar132;
              auVar111._0_8_ = SVar243.values.values._0_8_;
              auVar111._8_56_ = auVar131;
              Tmaj.values.values = (array<float,_4>)vmovlhps_avx(auVar111._0_16_,auVar193._0_16_);
              auVar131 = ZEXT856(Tmaj.values.values._8_8_);
              SVar243 = FastExp(&Tmaj);
              auVar194._0_8_ = SVar243.values.values._8_8_;
              auVar194._8_56_ = auVar132;
              auVar222 = auVar194._0_16_;
              auVar112._0_8_ = SVar243.values.values._0_8_;
              auVar112._8_56_ = auVar131;
              auVar216 = auVar112._0_16_;
            }
            bsdf._0_16_ = vmovlhps_avx(auVar216,auVar222);
            SampledSpectrum::operator*=(&TmajAccum,(SampledSpectrum *)&bsdf);
            auVar50 = ZEXT464((uint)tMax);
            fVar43 = local_3f8._0_4_;
            in_ZMM1 = ZEXT464((uint)local_3f8._0_4_);
            if ((tMax < local_3f8._0_4_) ||
               (iVar28 = voxel[iVar27], voxel[iVar27] = iVar28 + step[iVar27],
               iVar28 + step[iVar27] == voxelLimit[iVar27])) break;
            local_538._0_4_ = local_458;
            nextCrossingT[iVar27] = fVar43 + deltaT[iVar27];
            uVar24 = (ulong)(uint)pDVar2->lambda_min;
            iVar28 = *piVar34;
          }
        }
        else {
          auVar50 = ZEXT464(0x3f800000);
          SampledSpectrum::SampledSpectrum((SampledSpectrum *)&bsdf,1.0);
        }
      }
    }
    goto LAB_00413e9e;
  }
  goto LAB_00413eb1;
LAB_00413e8c:
  auVar50 = ZEXT1664((undefined1  [16])TmajAccum.values.values);
  bsdf._0_16_ = TmajAccum.values.values;
LAB_00413e9e:
  if ((terminated & 1U) != 0) goto LAB_0041437a;
LAB_00413eb1:
  auVar132 = in_ZMM1._8_56_;
  auVar131 = auVar50._8_56_;
  if (scattered != true) {
    if (si.set != true) {
      this_02 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                 *)(local_3f0->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                   infiniteLights.
                   super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
                   .super__Vector_impl_data._M_start;
      pTVar9 = *(TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                 **)((long)&(local_3f0->super_RayIntegrator).super_ImageTileIntegrator.
                            super_Integrator.infiniteLights.
                            super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                            ._M_impl.super__Vector_impl_data + 8);
      while( true ) {
        auVar132 = in_ZMM1._8_56_;
        auVar131 = auVar50._8_56_;
        if (this_02 == pTVar9) break;
        func.lambda = lambda;
        func.ray = &ray->super_Ray;
        SVar243 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                  ::
                  Dispatch<pbrt::LightHandle::Le(pbrt::Ray_const&,pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                            (this_02,func);
        auVar211._0_8_ = SVar243.values.values._8_8_;
        auVar211._8_56_ = auVar132;
        auVar128._0_8_ = SVar243.values.values._0_8_;
        auVar128._8_56_ = auVar131;
        local_3a0._0_16_ = vmovlhps_avx(auVar128._0_16_,auVar211._0_16_);
        uVar130 = local_3a0._8_8_;
        SVar243 = SampledSpectrum::operator*(&beta,(SampledSpectrum *)local_3a0);
        auVar212._0_8_ = SVar243.values.values._8_8_;
        auVar212._8_56_ = auVar132;
        local_408._8_8_ = uVar130;
        local_408._0_8_ = SVar243.values.values._0_8_;
        local_538 = auVar212._0_16_;
        SVar243 = SampledWavelengths::PDF(lambda);
        auVar216 = local_408;
        auVar39 = local_538;
        a_00.values.values[2] = (float)local_538._0_4_;
        a_00.values.values[3] = (float)local_538._4_4_;
        a_00.values.values[0] = (float)local_408._0_4_;
        a_00.values.values[1] = (float)local_408._4_4_;
        auVar132 = ZEXT856((ulong)local_538._8_8_);
        auVar131 = ZEXT856((ulong)local_408._8_8_);
        local_538 = auVar39;
        local_408 = auVar216;
        SVar243 = SafeDiv(a_00,SVar243);
        in_ZMM1._0_8_ = SVar243.values.values._8_8_;
        in_ZMM1._8_56_ = auVar132;
        auVar129._0_8_ = SVar243.values.values._0_8_;
        auVar129._8_56_ = auVar131;
        bsdf._0_16_ = vmovlhps_avx(auVar129._0_16_,in_ZMM1._0_16_);
        auVar50 = ZEXT1664((undefined1  [16])bsdf._0_16_);
        SampledSpectrum::operator+=(&L,(SampledSpectrum *)&bsdf);
        this_02 = this_02 + 8;
      }
LAB_0041437a:
      pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
      return (SampledSpectrum)L.values;
    }
    pSVar16 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    VVar240 = Tuple3<pbrt::Vector3,_float>::operator-(&this_00->super_Tuple3<pbrt::Vector3,_float>);
    SVar243 = SurfaceInteraction::Le
                        (&pSVar16->intr,(Vector3f)VVar240.super_Tuple3<pbrt::Vector3,_float>,lambda)
    ;
    auVar204._0_8_ = SVar243.values.values._8_8_;
    auVar204._8_56_ = auVar132;
    auVar121._0_8_ = SVar243.values.values._0_8_;
    auVar121._8_56_ = auVar131;
    local_3a0._0_16_ = vmovlhps_avx(auVar121._0_16_,auVar204._0_16_);
    uVar130 = local_3a0._8_8_;
    SVar243 = SampledSpectrum::operator*(&beta,(SampledSpectrum *)local_3a0);
    auVar205._0_8_ = SVar243.values.values._8_8_;
    auVar205._8_56_ = auVar132;
    local_408._8_8_ = uVar130;
    local_408._0_8_ = SVar243.values.values._0_8_;
    local_538 = auVar205._0_16_;
    SVar243 = SampledWavelengths::PDF(lambda);
    auVar216 = local_408;
    auVar39 = local_538;
    a.values.values[2] = (float)local_538._0_4_;
    a.values.values[3] = (float)local_538._4_4_;
    a.values.values[0] = (float)local_408._0_4_;
    a.values.values[1] = (float)local_408._4_4_;
    auVar132 = ZEXT856((ulong)local_538._8_8_);
    auVar131 = ZEXT856((ulong)local_408._8_8_);
    local_538 = auVar39;
    local_408 = auVar216;
    SVar243 = SafeDiv(a,SVar243);
    in_ZMM1._0_8_ = SVar243.values.values._8_8_;
    in_ZMM1._8_56_ = auVar132;
    auVar122._0_8_ = SVar243.values.values._0_8_;
    auVar122._8_56_ = auVar131;
    bsdf._0_16_ = vmovlhps_avx(auVar122._0_16_,in_ZMM1._0_16_);
    SampledSpectrum::operator+=(&L,(SampledSpectrum *)&bsdf);
    pSVar16 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    local_180.bits =
         (local_3f0->super_RayIntegrator).super_ImageTileIntegrator.camera.
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         .bits;
    local_188 = (sampler->
                super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
    SurfaceInteraction::GetBSDF
              (&bsdf,&pSVar16->intr,ray,lambda,(CameraHandle *)&local_180,buf,
               (SamplerHandle)&local_188);
    if (((undefined1  [16])bsdf._0_16_ & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0)
    {
      FVar41 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                           *)sampler);
      local_408._0_4_ = FVar41;
      u2 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
      VVar240 = Tuple3<pbrt::Vector3,_float>::operator-
                          (&this_00->super_Tuple3<pbrt::Vector3,_float>);
      BSDF::Sample_f((optional<pbrt::BSDFSample> *)local_3a0,&bsdf,
                     (Vector3f)VVar240.super_Tuple3<pbrt::Vector3,_float>,(Float)local_408._0_4_,u2,
                     Radiance,All);
      bVar15 = local_378._4_1_;
      pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)local_3a0);
      if (bVar15 == true) {
        ErrorExit<>("SimpleVolPathIntegrator doesn\'t support surface scattering.");
      }
      goto LAB_0041437a;
    }
    pSVar16 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    pSVar17 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    SurfaceInteraction::SkipIntersection(&pSVar16->intr,ray,pSVar17->tHit);
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
  goto LAB_00411b30;
}

Assistant:

SampledSpectrum SimpleVolPathIntegrator::Li(RayDifferential ray,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler, ScratchBuffer &buf,
                                            VisibleSurface *) const {
    SampledSpectrum L(0.f), beta(1.f);
    int numScatters = 0;
    // Terminate secondary wavelengths before starting random walk
    lambda.TerminateSecondary();

    while (true) {
        // Estimate radiance for ray path using delta tracking
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        bool scattered = false, terminated = false;
        if (ray.medium) {
            // Sample medium scattering using delta tracking
            uint64_t hash0 = Hash(sampler.Get1D());
            uint64_t hash1 = Hash(sampler.Get1D());
            RNG rng(hash0, hash1);
            Float tMax = si ? si->tHit : Infinity;
            Float u = sampler.Get1D();
            Float uMode = sampler.Get1D();
            ray.medium.SampleTmaj(ray, tMax, u, rng, lambda, [&](const MediumSample &ms) {
                const MediumInteraction &intr = ms.intr;
                // Compute medium event probabilities for interaction
                Float pAbsorb = intr.sigma_a[0] / intr.sigma_maj[0];
                Float pScatter = intr.sigma_s[0] / intr.sigma_maj[0];
                Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                // Randomly sample medium scattering event for delta tracking
                int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, uMode);
                if (mode == 0) {
                    // Handle absorption event for delta tracking
                    L += SafeDiv(beta * intr.Le, lambda.PDF());
                    terminated = true;
                    return false;

                } else if (mode == 1) {
                    // Handle regular scattering event for delta tracking
                    // Stop path sampling if maximum depth has been reached
                    if (numScatters++ >= maxDepth) {
                        terminated = true;
                        return false;
                    }

                    // Sample phase function for delta tracking scattering event
                    pstd::optional<PhaseFunctionSample> ps =
                        intr.phase.Sample_p(-ray.d, sampler.Get2D());
                    if (!ps) {
                        terminated = true;
                        return false;
                    }

                    // Update state for recursive $L_\roman{i}$ evaluation
                    beta *= ps->p / ps->pdf;
                    ray = intr.SpawnRay(ps->wi);
                    scattered = true;
                    return false;

                } else {
                    // Handle null scattering event for delta tracking
                    uMode = rng.Uniform<Float>();
                    return true;
                }
            });
        }
        // Handle terminated and unscattered rays after medium sampling
        if (terminated)
            return L;
        if (scattered)
            continue;
        // Add emission to un-scattered ray
        if (si)
            L += SafeDiv(beta * si->intr.Le(-ray.d, lambda), lambda.PDF());
        else {
            for (const auto &light : infiniteLights)
                L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
            return L;
        }

        // Handle surface intersection along delta tracking path
        BSDF bsdf = si->intr.GetBSDF(ray, lambda, camera, buf, sampler);
        if (!bsdf)
            si->intr.SkipIntersection(&ray, si->tHit);
        else {
            Float uc = sampler.Get1D();
            Point2f u = sampler.Get2D();
            if (bsdf.Sample_f(-ray.d, uc, u))
                ErrorExit("SimpleVolPathIntegrator doesn't support surface scattering.");
            else
                break;
        }
    }
    return L;
}